

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_constrained_multi_parallelogram_decoder.h
# Opt level: O1

bool __thiscall
draco::
MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,DecoderBuffer *buffer)

{
  long lVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  char cVar2;
  CornerTable *pCVar3;
  _Bit_type *p_Var4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  _Bit_type _Var11;
  ulong __new_size;
  uint32_t j;
  ulong uVar12;
  uint32_t num_flags;
  RAnsBitDecoder decoder;
  uint local_6c;
  MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *local_68;
  DecoderBuffer *local_60;
  vector<bool,_std::allocator<bool>_> *local_58;
  ulong local_50;
  RAnsBitDecoder local_48;
  
  if (buffer->bitstream_version_ < 0x202) {
    lVar1 = buffer->pos_ + 1;
    if ((buffer->data_size_ < lVar1) ||
       (cVar2 = buffer->data_[buffer->pos_], buffer->pos_ = lVar1, cVar2 != '\0')) {
      return false;
    }
  }
  local_58 = this->is_crease_edge_;
  uVar8 = 0;
  uVar7 = 0;
  local_68 = this;
  local_60 = buffer;
  do {
    local_50 = uVar7;
    bVar5 = anon_unknown_80::DecodeVarintUnsigned<unsigned_int>(1,&local_6c,buffer);
    if (!bVar5) {
LAB_0014aefa:
      if ((local_50 & 1) == 0) {
        return false;
      }
      break;
    }
    __new_size = (ulong)local_6c;
    pCVar3 = ((this->
              super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
              ).mesh_data_.corner_table_)->corner_table_;
    uVar7 = (ulong)((long)(pCVar3->corner_to_vertex_map_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar3->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2;
    if ((uint)uVar7 < local_6c) goto LAB_0014aefa;
    if (__new_size != 0) {
      this_00 = local_58 + uVar8;
      std::vector<bool,_std::allocator<bool>_>::resize(this_00,__new_size,false);
      RAnsBitDecoder::RAnsBitDecoder(&local_48);
      bVar5 = RAnsBitDecoder::StartDecoding(&local_48,buffer);
      if (bVar5) {
        uVar12 = 0;
        do {
          bVar6 = RAnsBitDecoder::DecodeNextBit(&local_48);
          p_Var4 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar9 = uVar12 >> 6;
          uVar7 = uVar12 & 0xffffffff;
          uVar10 = 1L << ((byte)uVar7 & 0x3f);
          if (bVar6) {
            _Var11 = uVar10 | p_Var4[uVar9];
          }
          else {
            _Var11 = ~uVar10 & p_Var4[uVar9];
          }
          p_Var4[uVar9] = _Var11;
          uVar12 = uVar12 + 1;
        } while (__new_size != uVar12);
        RAnsBitDecoder::~RAnsBitDecoder(&local_48);
        buffer = local_60;
        this = local_68;
        if (bVar5) goto LAB_0014aecc;
      }
      else {
        RAnsBitDecoder::~RAnsBitDecoder(&local_48);
        buffer = local_60;
        this = local_68;
      }
      goto LAB_0014aefa;
    }
LAB_0014aecc:
    bVar5 = 2 < uVar8;
    uVar8 = uVar8 + 1;
    uVar7 = CONCAT71((int7)(uVar7 >> 8),bVar5);
  } while (uVar8 != 4);
  bVar5 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                    (&(this->
                      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                      ).
                      super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                      .transform_,buffer);
  return bVar5;
}

Assistant:

bool MeshPredictionSchemeConstrainedMultiParallelogramDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    // Decode prediction mode.
    uint8_t mode;
    if (!buffer->Decode(&mode)) {
      return false;
    }

    if (mode != Mode::OPTIMAL_MULTI_PARALLELOGRAM) {
      // Unsupported mode.
      return false;
    }
  }
#endif

  // Encode selected edges using separate rans bit coder for each context.
  for (int i = 0; i < kMaxNumParallelograms; ++i) {
    uint32_t num_flags;
    if (!DecodeVarint<uint32_t>(&num_flags, buffer)) {
      return false;
    }
    if (num_flags > this->mesh_data().corner_table()->num_corners()) {
      return false;
    }
    if (num_flags > 0) {
      is_crease_edge_[i].resize(num_flags);
      RAnsBitDecoder decoder;
      if (!decoder.StartDecoding(buffer)) {
        return false;
      }
      for (uint32_t j = 0; j < num_flags; ++j) {
        is_crease_edge_[i][j] = decoder.DecodeNextBit();
      }
      decoder.EndDecoding();
    }
  }
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}